

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  Builder builder_00;
  Builder builder_01;
  Array<capnp::word> *pAVar1;
  RemoveConst<kj::Array<capnp::word>_> *pRVar2;
  Array<capnp::word> *pAVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  SegmentInit *firstElement;
  SegmentBuilder *pSVar5;
  void *pvVar6;
  SegmentInit *ptrCopy;
  ArrayPtr<const_capnp::word> *pAVar7;
  SegmentInit *pSVar8;
  size_t sVar9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar10;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments;
  Reader value;
  Fault f;
  CapTableBuilder *pCStack_300;
  int local_2dc;
  PointerBuilder local_2d8;
  StructBuilder local_2b8;
  Builder local_290;
  Array<capnp::MessageBuilder::SegmentInit> segInits;
  WirePointer local_260;
  StructBuilder local_258;
  StructBuilder local_230;
  TestInitMessageBuilder builder2;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,1,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&f,&builder.super_MessageBuilder);
  builder2.super_MessageBuilder._vptr_MessageBuilder._0_4_ = SUB84(f.exception,0);
  builder2.super_MessageBuilder._vptr_MessageBuilder._4_4_ =
       (undefined4)((ulong)f.exception >> 0x20);
  builder2.super_MessageBuilder.arenaSpace[0] = pCStack_300;
  PointerBuilder::getStruct(&local_230,(PointerBuilder *)&builder2,(StructSize)0x140006,(word *)0x0)
  ;
  builder_01._builder.capTable = (CapTableBuilder *)local_230.pointers;
  builder_01._builder.segment = (SegmentBuilder *)local_230.data;
  builder_01._builder.data = (void *)local_230._32_8_;
  builder_01._builder.pointers._0_4_ = builder2.super_MessageBuilder._vptr_MessageBuilder._0_4_;
  builder_01._builder.pointers._4_4_ = builder2.super_MessageBuilder._vptr_MessageBuilder._4_4_;
  builder_01._builder._32_8_ = builder2.super_MessageBuilder.arenaSpace[0];
  initTestMessage(builder_01);
  AVar10 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  pvVar6 = (void *)AVar10.size_;
  pAVar4 = AVar10.ptr;
  builder2.super_MessageBuilder._vptr_MessageBuilder._0_4_ = 1;
  builder2.super_MessageBuilder.arenaSpace[1] = anon_var_dwarf_6da99;
  builder2.super_MessageBuilder.arenaSpace[2] = &DAT_00000005;
  builder2.super_MessageBuilder.arenaSpace[3]._0_1_ = pvVar6 != (void *)0x1;
  builder2.super_MessageBuilder.arenaSpace[0] = pvVar6;
  if (!(bool)builder2.super_MessageBuilder.arenaSpace[3]._0_1_) {
    local_2d8.segment = (SegmentBuilder *)CONCAT44(local_2d8.segment._4_4_,1);
    local_2b8.segment = (SegmentBuilder *)0x1;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x67,FAILED,"(1) != (segs.size())","_kjCondition,1, segs.size()",
               (DebugComparison<int,_unsigned_long> *)&builder2,(int *)&local_2d8,
               (unsigned_long *)&local_2b8);
    kj::_::Debug::Fault::fatal(&f);
  }
  firstElement = (SegmentInit *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (0x18,0,(size_t)pvVar6,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
  pSVar8 = firstElement;
  if (pvVar6 != (void *)0x0) {
    pAVar7 = pAVar4 + (long)pvVar6;
    do {
      sVar9 = pAVar4->size_;
      (pSVar8->space).ptr = pAVar4->ptr;
      (pSVar8->space).size_ = sVar9;
      pSVar8->wordsUsed = sVar9;
      pSVar8 = pSVar8 + 1;
      pAVar4 = pAVar4 + 1;
    } while (pAVar4 != pAVar7);
  }
  sVar9 = ((long)pSVar8 - (long)firstElement >> 3) * -0x5555555555555555;
  segInits.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  segments.size_ = sVar9;
  segments.ptr = firstElement;
  segInits.ptr = firstElement;
  segInits.size_ = sVar9;
  MessageBuilder::MessageBuilder(&builder2.super_MessageBuilder,segments);
  builder2.super_MessageBuilder._vptr_MessageBuilder._0_4_ = 0x36b060;
  builder2.super_MessageBuilder._vptr_MessageBuilder._4_4_ = 0;
  builder2.allocations.builder.ptr = (Array<capnp::word> *)0x0;
  builder2.allocations.builder.pos = (RemoveConst<kj::Array<capnp::word>_> *)0x0;
  builder2.allocations.builder.endPtr = (Array<capnp::word> *)0x0;
  builder2.allocations.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  MessageBuilder::getRootInternal((Builder *)&local_2b8,&builder2.super_MessageBuilder);
  pvVar6 = local_2b8.data;
  f.exception = (Exception *)local_2b8.segment;
  PointerBuilder::getStruct(&local_258,(PointerBuilder *)&f,(StructSize)0x140006,(word *)0x0);
  builder_00._builder.capTable = local_258.capTable;
  builder_00._builder.segment = local_258.segment;
  builder_00._builder.data = local_258.data;
  builder_00._builder.pointers = local_258.pointers;
  builder_00._builder.dataSize = local_258.dataSize;
  builder_00._builder.pointerCount = local_258.pointerCount;
  builder_00._builder._38_2_ = local_258._38_2_;
  checkTestMessage(builder_00);
  MessageBuilder::getRootInternal((Builder *)&local_2d8,&builder2.super_MessageBuilder);
  local_2b8.data = local_2d8.pointer;
  local_2b8.segment = local_2d8.segment;
  local_2b8.capTable = local_2d8.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&f,(PointerBuilder *)&local_2b8,(StructSize)0x140006,(word *)0x0);
  *(undefined8 *)((long)pvVar6 + 8) = 0x1e1b9;
  MessageBuilder::getRootInternal(&local_290,&builder.super_MessageBuilder);
  local_2d8.pointer = local_290.builder.pointer;
  local_2d8.segment = local_290.builder.segment;
  local_2d8.capTable = local_290.builder.capTable;
  PointerBuilder::getStruct(&local_2b8,&local_2d8,(StructSize)0x140006,(word *)0x0);
  f.exception._0_4_ = 0x1e1b9;
  if (kj::_::Debug::minSeverity < 3 &&
      *(WirePointer *)((long)local_2b8.data + 8) != (WirePointer)0x1e1b9) {
    local_2dc = 0x1e1b9;
    MessageBuilder::getRootInternal(&local_290,&builder.super_MessageBuilder);
    local_2d8.pointer = local_290.builder.pointer;
    local_2d8.segment = local_290.builder.segment;
    local_2d8.capTable = local_290.builder.capTable;
    PointerBuilder::getStruct(&local_2b8,&local_2d8,(StructSize)0x140006,(word *)0x0);
    local_260 = *(WirePointer *)((long)local_2b8.data + 8);
    kj::_::Debug::log<char_const(&)[79],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", _kjCondition, 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
               ,(char (*) [79])
                "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
               (DebugComparison<int,_long> *)&f,&local_2dc,(long *)&local_260);
  }
  pSVar5 = (SegmentBuilder *)
           (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr >> 3) *
           -0x5555555555555555);
  f.exception = f.exception & 0xffffffff00000000;
  if ((builder2.allocations.builder.pos != builder2.allocations.builder.ptr) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2d8.segment = (SegmentBuilder *)((ulong)local_2d8.segment & 0xffffffff00000000);
    local_2b8.segment = pSVar5;
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(0) == (builder2.allocations.size())\", _kjCondition, 0, builder2.allocations.size()"
               ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",
               (DebugComparison<int,_unsigned_long> *)&f,(int *)&local_2d8,
               (unsigned_long *)&local_2b8);
  }
  MessageBuilder::getRootInternal((Builder *)&local_2d8,&builder2.super_MessageBuilder);
  local_2b8.data = local_2d8.pointer;
  local_2b8.segment = local_2d8.segment;
  local_2b8.capTable = local_2d8.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&f,(PointerBuilder *)&local_2b8,(StructSize)0x140006,(word *)0x0);
  local_2b8.segment = (SegmentBuilder *)f.exception;
  local_2b8.data = &DAT_00000005;
  value.super_StringPtr.content.size_ = 10;
  value.super_StringPtr.content.ptr = "foobarbaz";
  local_2b8.capTable = (CapTableBuilder *)pSVar5;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_2b8,value);
  f.exception._0_4_ = 1;
  if (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr != 0x18) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2d8.segment = (SegmentBuilder *)CONCAT44(local_2d8.segment._4_4_,1);
    local_2b8.segment =
         (SegmentBuilder *)
         (((long)builder2.allocations.builder.pos - (long)builder2.allocations.builder.ptr >> 3) *
         -0x5555555555555555);
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x78,ERROR,
               "\"failed: expected \" \"(1) == (builder2.allocations.size())\", _kjCondition, 1, builder2.allocations.size()"
               ,(char (*) [54])"failed: expected (1) == (builder2.allocations.size())",
               (DebugComparison<int,_unsigned_long> *)&f,(int *)&local_2d8,
               (unsigned_long *)&local_2b8);
  }
  pAVar3 = builder2.allocations.builder.endPtr;
  pRVar2 = builder2.allocations.builder.pos;
  pAVar1 = builder2.allocations.builder.ptr;
  builder2.super_MessageBuilder._vptr_MessageBuilder._0_4_ = 0x36b060;
  builder2.super_MessageBuilder._vptr_MessageBuilder._4_4_ = 0;
  if (builder2.allocations.builder.ptr != (Array<capnp::word> *)0x0) {
    builder2.allocations.builder.ptr = (Array<capnp::word> *)0x0;
    builder2.allocations.builder.pos = (RemoveConst<kj::Array<capnp::word>_> *)0x0;
    builder2.allocations.builder.endPtr = (Array<capnp::word> *)0x0;
    (*(code *)**(undefined8 **)builder2.allocations.builder.disposer)
              (builder2.allocations.builder.disposer,pAVar1,0x18,
               ((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,
               kj::ArrayDisposer::Dispose_<kj::Array<capnp::word>_>::destruct);
  }
  FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)&builder2);
  if (firstElement != (SegmentInit *)0x0) {
    segInits.ptr = (SegmentInit *)0x0;
    segInits.size_ = 0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,0x18,sVar9,
               sVar9,(_func_void_void_ptr *)0x0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Message, MessageBuilderInitMultiSegment) {
  // Same as previous test, but with a message containing many segments.

  MallocMessageBuilder builder(1, AllocationStrategy::FIXED_SIZE);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Pull the segments out and make a segment init table out of them.
  //
  // We const_cast for simplicity of implementing the test, but you shouldn't do that at home. :)
  auto segs = builder.getSegmentsForOutput();
  ASSERT_NE(1, segs.size());

  auto segInits = KJ_MAP(seg, segs) -> MessageBuilder::SegmentInit {
    return { kj::arrayPtr(const_cast<word*>(seg.begin()), seg.size()), seg.size() };
  };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(segInits);
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Force builder2 to allocate new space.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(1, builder2.allocations.size());
}